

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReOrderJointTypes
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *origJTIndexMapping,
          vector<double,_std::allocator<double>_> *origValues,
          vector<double,_std::allocator<double>_> *orderedValues,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jtIndexMapping)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  E *this_00;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  size_type __n;
  allocator_type local_59;
  pointer local_58;
  pointer local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_50 = (origJTIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_58 = (origJTIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)local_58 - (long)local_50 >> 2;
  lVar7 = (long)(origValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(origValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((__n != lVar7 >> 3) ||
     (lVar7 != (long)(orderedValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(orderedValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start)) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "BGIP_SolverBranchAndBound::ReOrderJointTypes() std::vectors should all have the same length"
        );
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,__n,&BGIP_BnB::UNSPECIFIED_ACTION,&local_59);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(jtIndexMapping);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58 != local_50) {
    pdVar3 = (origValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (orderedValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (origJTIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      dVar1 = pdVar3[uVar8];
      puVar6 = (jtIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = 1;
      uVar10 = 0;
      do {
        dVar2 = pdVar4[uVar10];
        if (((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) && (puVar6[uVar10] == 0xffffffff)) {
          puVar6[uVar10] = puVar5[uVar8];
          break;
        }
        uVar10 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (__n != uVar10);
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (__n != uVar8);
  }
  return;
}

Assistant:

void ReOrderJointTypes(
            const std::vector<Index> &origJTIndexMapping,
            const std::vector<double> &origValues,
            const std::vector<double> &orderedValues,
            std::vector<Index>& jtIndexMapping ) const{
    if((origJTIndexMapping.size() != origValues.size()) ||
       (origValues.size()!=orderedValues.size()))
        throw(E("BGIP_SolverBranchAndBound::ReOrderJointTypes() std::vectors should all have the same length"));

    size_t nrJTypes=origJTIndexMapping.size();
    jtIndexMapping = std::vector<Index>(nrJTypes, UNSPECIFIED_ACTION);

    //we search where jt_bgI ended up
    for(Index jt_bgI=0;jt_bgI!=nrJTypes;++jt_bgI)
    {
        //the original value of the jt_bgI-th joint type (of the BG)
        double origValue=origValues[jt_bgI];
        for(Index jt_oI=0;jt_oI!=nrJTypes;++jt_oI)
        {
            if(orderedValues[jt_oI]==origValue &&
               //make sure that jt_oI is not specified yet (in
               //case of equal vals)
               jtIndexMapping[jt_oI]==UNSPECIFIED_ACTION)
            {
                jtIndexMapping[jt_oI]=origJTIndexMapping[jt_bgI];
                break;
            }
        }
    }
}